

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O2

void __thiscall Train::show(Train *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Name of start station is: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name_of_station);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Name of end station is: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->name_of_station).name_end_station);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Time in road: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->time_in_road);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of train is: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->number_train);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of carriages is: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->count_of_carriages);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Train::show() const{
    std::cout << "Name of start station is: " <<  name_of_station.name_start_station << std::endl;
    std::cout << "Name of end station is: " <<  name_of_station.name_end_station << std::endl;
    std::cout << "Time in road: " << time_in_road << std::endl;
    std::cout << "Number of train is: " << number_train << std::endl;
    std::cout << "Number of carriages is: " << count_of_carriages << std::endl;
}